

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2rect.cc
# Opt level: O2

ostream * operator<<(ostream *os,R2Rect *r)

{
  ostream *poVar1;
  D local_28;
  D local_18;
  
  poVar1 = std::operator<<(os,"[Lo");
  local_18.c_[0] = r->bounds_[0].bounds_.c_[0];
  local_18.c_[1] = r->bounds_[1].bounds_.c_[0];
  poVar1 = util::math::internal_vector::operator<<(poVar1,&local_18);
  poVar1 = std::operator<<(poVar1,", Hi");
  local_28.c_[0] = r->bounds_[0].bounds_.c_[1];
  local_28.c_[1] = r->bounds_[1].bounds_.c_[1];
  poVar1 = util::math::internal_vector::operator<<(poVar1,&local_28);
  poVar1 = std::operator<<(poVar1,"]");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const R2Rect& r) {
  return os << "[Lo" << r.lo() << ", Hi" << r.hi() << "]";
}